

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::format
          (TimeZoneFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  UErrorCode *this_00;
  UBool UVar1;
  Type TVar2;
  int32_t iVar3;
  Calendar *local_1e0;
  Calendar *local_1d0;
  undefined1 local_1a8 [8];
  UnicodeString result;
  UChar buf [128];
  int local_60;
  int local_5c;
  int32_t dstOffset;
  int32_t rawOffset;
  Calendar *cal;
  TimeZone *tz;
  UObject *formatObj;
  UDate date;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  Formattable *obj_local;
  TimeZoneFormat *this_local;
  
  date = (UDate)status;
  status_local = (UErrorCode *)pos;
  pos_local = (FieldPosition *)appendTo;
  appendTo_local = (UnicodeString *)obj;
  obj_local = (Formattable *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    formatObj = (UObject *)Calendar::getNow();
    TVar2 = Formattable::getType((Formattable *)appendTo_local);
    if (TVar2 == kObject) {
      tz = (TimeZone *)Formattable::getObject((Formattable *)appendTo_local);
      if (tz == (TimeZone *)0x0) {
        local_1d0 = (Calendar *)0x0;
      }
      else {
        local_1d0 = (Calendar *)__dynamic_cast(tz,&UObject::typeinfo,&TimeZone::typeinfo,0);
      }
      cal = local_1d0;
      if (local_1d0 == (Calendar *)0x0) {
        if (tz == (TimeZone *)0x0) {
          local_1e0 = (Calendar *)0x0;
        }
        else {
          local_1e0 = (Calendar *)__dynamic_cast(tz,&UObject::typeinfo,&Calendar::typeinfo,0);
        }
        _dstOffset = local_1e0;
        if (local_1e0 != (Calendar *)0x0) {
          cal = (Calendar *)Calendar::getTimeZone(local_1e0);
          formatObj = (UObject *)Calendar::getTime(_dstOffset,(UErrorCode *)date);
        }
      }
      if (cal != (Calendar *)0x0) {
        (*(cal->super_UObject)._vptr_UObject[6])(formatObj,cal,0,&local_5c,&local_60,date);
        UnicodeString::UnicodeString
                  ((UnicodeString *)local_1a8,result.fUnion.fStackFields.fBuffer + 0x17,0,0x80);
        formatOffsetLocalizedGMT
                  (this,local_5c + local_60,(UnicodeString *)local_1a8,(UErrorCode *)date);
        UVar1 = ::U_SUCCESS(*(UErrorCode *)date);
        if (UVar1 != '\0') {
          UnicodeString::append((UnicodeString *)pos_local,(UnicodeString *)local_1a8);
          iVar3 = FieldPosition::getField((FieldPosition *)status_local);
          if (iVar3 == 0x11) {
            FieldPosition::setBeginIndex((FieldPosition *)status_local,0);
            this_00 = status_local;
            iVar3 = UnicodeString::length((UnicodeString *)local_1a8);
            FieldPosition::setEndIndex((FieldPosition *)this_00,iVar3);
          }
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_1a8);
      }
    }
    this_local = (TimeZoneFormat *)pos_local;
  }
  else {
    this_local = (TimeZoneFormat *)pos_local;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZoneFormat::format(const Formattable& obj, UnicodeString& appendTo,
        FieldPosition& pos, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    UDate date = Calendar::getNow();
    if (obj.getType() == Formattable::kObject) {
        const UObject* formatObj = obj.getObject();
        const TimeZone* tz = dynamic_cast<const TimeZone*>(formatObj);
        if (tz == NULL) {
            const Calendar* cal = dynamic_cast<const Calendar*>(formatObj);
            if (cal != NULL) {
                tz = &cal->getTimeZone();
                date = cal->getTime(status);
            }
        }
        if (tz != NULL) {
            int32_t rawOffset, dstOffset;
            tz->getOffset(date, FALSE, rawOffset, dstOffset, status);
            UChar buf[ZONE_NAME_U16_MAX];
            UnicodeString result(buf, 0, UPRV_LENGTHOF(buf));
            formatOffsetLocalizedGMT(rawOffset + dstOffset, result, status);
            if (U_SUCCESS(status)) {
                appendTo.append(result);
                if (pos.getField() == UDAT_TIMEZONE_FIELD) {
                    pos.setBeginIndex(0);
                    pos.setEndIndex(result.length());
                }
            }
        }
    }
    return appendTo;
}